

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::neverReturn(TestMoreStuffImpl *this,NeverReturnContext context)

{
  Promise<void> *pPVar1;
  PromiseNode *extraout_RDX;
  Promise<void> PVar2;
  Reader local_120;
  Client local_f0;
  Maybe<capnp::MessageSize> local_d8;
  Builder local_c0;
  Reader local_88;
  Client local_58;
  undefined1 local_40 [24];
  Promise<void> promise;
  TestMoreStuffImpl *this_local;
  NeverReturnContext context_local;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  promise.super_PromiseBase.node.ptr = (PromiseNode *)context.hook;
  context_local.hook = (CallContextHook *)this;
  kj::_::NeverDone::operator_cast_to_Promise((NeverDone *)local_40);
  CallContext<capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,_capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>
  ::getParams(&local_88,
              (CallContext<capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,_capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>
               *)&this_local);
  capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams::Reader::getCap(&local_58,&local_88)
  ;
  kj::Promise<void>::attach<capnproto_test::capnp::test::TestInterface::Client>
            ((Promise<void> *)(local_40 + 0x10),(Client *)local_40);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_58);
  kj::Promise<void>::~Promise((Promise<void> *)local_40);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_d8,(void *)0x0);
  CallContext<capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,_capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>
  ::getResults(&local_c0,
               (CallContext<capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,_capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>
                *)&this_local,&local_d8);
  CallContext<capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,_capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>
  ::getParams(&local_120,
              (CallContext<capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,_capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>
               *)&this_local);
  capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams::Reader::getCap
            (&local_f0,&local_120);
  capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults::Builder::setCapCopy
            (&local_c0,&local_f0);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_f0);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_d8);
  CallContext<capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,_capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>
  ::allowCancellation((CallContext<capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,_capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>
                       *)&this_local);
  pPVar1 = kj::mv<kj::Promise<void>>((Promise<void> *)(local_40 + 0x10));
  kj::Promise<void>::Promise((Promise<void> *)this,pPVar1);
  kj::Promise<void>::~Promise((Promise<void> *)(local_40 + 0x10));
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::neverReturn(NeverReturnContext context) {
  ++callCount;

  // Attach `cap` to the promise to make sure it is released.
  auto promise = kj::Promise<void>(kj::NEVER_DONE).attach(context.getParams().getCap());

  // Also attach `cap` to the result struct to make sure that is released.
  context.getResults().setCapCopy(context.getParams().getCap());

  context.allowCancellation();
  return kj::mv(promise);
}